

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall deqp::egl::Image::ModifyTests::addModifyActions(ModifyTests *this)

{
  ModifyTexSubImage *pMVar1;
  ModifyRenderbufferClearColor *this_00;
  ModifyRenderbufferClearDepth *this_01;
  ModifyRenderbufferClearStencil *this_02;
  DefaultDeleter<deqp::egl::Image::Action> local_229;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_228;
  allocator<char> local_211;
  string local_210;
  DefaultDeleter<deqp::egl::Image::Action> local_1e9;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_1e8;
  allocator<char> local_1d1;
  string local_1d0;
  DefaultDeleter<deqp::egl::Image::Action> local_1a9;
  Vector<float,_4> local_1a8;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_198;
  allocator<char> local_181;
  string local_180;
  DefaultDeleter<deqp::egl::Image::Action> local_159;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_158;
  allocator<char> local_141;
  string local_140;
  DefaultDeleter<deqp::egl::Image::Action> local_119;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_118;
  allocator<char> local_101;
  string local_100;
  DefaultDeleter<deqp::egl::Image::Action> local_d9;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_d8;
  allocator<char> local_c1;
  string local_c0;
  DefaultDeleter<deqp::egl::Image::Action> local_99;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_98;
  allocator<char> local_81;
  string local_80;
  DefaultDeleter<deqp::egl::Image::Action> local_59;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_58 [2];
  allocator<char> local_31;
  string local_30;
  ModifyTests *local_10;
  ModifyTests *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"tex_subimage_rgb8",&local_31);
  pMVar1 = (ModifyTexSubImage *)operator_new(0x10);
  GLES2ImageApi::ModifyTexSubImage::ModifyTexSubImage(pMVar1,0x1907,0x1401);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_59);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(local_58,pMVar1);
  LabeledActions::add(&this->m_modifyActions,&local_30,local_58);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(local_58);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"tex_subimage_rgb565",&local_81);
  pMVar1 = (ModifyTexSubImage *)operator_new(0x10);
  GLES2ImageApi::ModifyTexSubImage::ModifyTexSubImage(pMVar1,0x1907,0x8363);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_99);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_98,pMVar1);
  LabeledActions::add(&this->m_modifyActions,&local_80,&local_98);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_98);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"tex_subimage_rgba8",&local_c1);
  pMVar1 = (ModifyTexSubImage *)operator_new(0x10);
  GLES2ImageApi::ModifyTexSubImage::ModifyTexSubImage(pMVar1,0x1908,0x1401);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_d9);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_d8,pMVar1);
  LabeledActions::add(&this->m_modifyActions,&local_c0,&local_d8);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_d8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"tex_subimage_rgb5_a1",&local_101);
  pMVar1 = (ModifyTexSubImage *)operator_new(0x10);
  GLES2ImageApi::ModifyTexSubImage::ModifyTexSubImage(pMVar1,0x1908,0x8034);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_119);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_118,pMVar1);
  LabeledActions::add(&this->m_modifyActions,&local_100,&local_118);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_118);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"tex_subimage_rgba4",&local_141);
  pMVar1 = (ModifyTexSubImage *)operator_new(0x10);
  GLES2ImageApi::ModifyTexSubImage::ModifyTexSubImage(pMVar1,0x1908,0x8033);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_159);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_158,pMVar1);
  LabeledActions::add(&this->m_modifyActions,&local_140,&local_158);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_158);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"renderbuffer_clear_color",&local_181);
  this_00 = (ModifyRenderbufferClearColor *)operator_new(0x18);
  tcu::Vector<float,_4>::Vector(&local_1a8,0.3,0.5,0.3,1.0);
  GLES2ImageApi::ModifyRenderbufferClearColor::ModifyRenderbufferClearColor(this_00,&local_1a8);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_1a9);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_198,this_00);
  LabeledActions::add(&this->m_modifyActions,&local_180,&local_198);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_198);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"renderbuffer_clear_depth",&local_1d1);
  this_01 = (ModifyRenderbufferClearDepth *)operator_new(0x10);
  GLES2ImageApi::ModifyRenderbufferClearDepth::ModifyRenderbufferClearDepth(this_01,0.7);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_1e9);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_1e8,this_01);
  LabeledActions::add(&this->m_modifyActions,&local_1d0,&local_1e8);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_1e8);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"renderbuffer_clear_stencil",&local_211);
  this_02 = (ModifyRenderbufferClearStencil *)operator_new(0x10);
  GLES2ImageApi::ModifyRenderbufferClearStencil::ModifyRenderbufferClearStencil(this_02,0x4e);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_229);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_228,this_02);
  LabeledActions::add(&this->m_modifyActions,&local_210,&local_228);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_228);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  return;
}

Assistant:

void ModifyTests::addModifyActions (void)
{
	m_modifyActions.add("tex_subimage_rgb8",			MovePtr<Action>(new GLES2ImageApi::ModifyTexSubImage(GL_RGB,	GL_UNSIGNED_BYTE)));
	m_modifyActions.add("tex_subimage_rgb565",			MovePtr<Action>(new GLES2ImageApi::ModifyTexSubImage(GL_RGB,	GL_UNSIGNED_SHORT_5_6_5)));
	m_modifyActions.add("tex_subimage_rgba8",			MovePtr<Action>(new GLES2ImageApi::ModifyTexSubImage(GL_RGBA,	GL_UNSIGNED_BYTE)));
	m_modifyActions.add("tex_subimage_rgb5_a1",			MovePtr<Action>(new GLES2ImageApi::ModifyTexSubImage(GL_RGBA,	GL_UNSIGNED_SHORT_5_5_5_1)));
	m_modifyActions.add("tex_subimage_rgba4",			MovePtr<Action>(new GLES2ImageApi::ModifyTexSubImage(GL_RGBA,	GL_UNSIGNED_SHORT_4_4_4_4)));

	m_modifyActions.add("renderbuffer_clear_color",		MovePtr<Action>(new GLES2ImageApi::ModifyRenderbufferClearColor(tcu::Vec4(0.3f, 0.5f, 0.3f, 1.0f))));
	m_modifyActions.add("renderbuffer_clear_depth",		MovePtr<Action>(new GLES2ImageApi::ModifyRenderbufferClearDepth(0.7f)));
	m_modifyActions.add("renderbuffer_clear_stencil",	MovePtr<Action>(new GLES2ImageApi::ModifyRenderbufferClearStencil(78)));
}